

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O1

long vorbis_book_decodev_add(codebook *book,float *a,oggpack_buffer *b,int n)

{
  long lVar1;
  float *pfVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if ((0 < book->used_entries) && (bVar3 = 0 < n, 0 < n)) {
    lVar4 = decode_packed_entry_number(book,b);
    if ((int)lVar4 != -1) {
      lVar6 = 0;
      do {
        lVar5 = book->dim;
        lVar4 = (int)lVar4 * lVar5;
        pfVar2 = book->valuelist;
        lVar6 = (long)(int)lVar6;
        if (lVar5 < 1) {
          lVar5 = 0;
        }
        lVar7 = 0;
        do {
          lVar1 = lVar7;
          if (lVar5 == lVar7) break;
          lVar1 = lVar7 + 1;
          a[lVar6 + lVar7] = pfVar2[lVar4 + lVar7] + a[lVar6 + lVar7];
          lVar7 = lVar1;
        } while ((ulong)(uint)n - lVar6 != lVar1);
        lVar6 = lVar6 + lVar1;
        bVar3 = (int)lVar6 < n;
        if (n <= (int)lVar6) {
          return 0;
        }
        lVar4 = decode_packed_entry_number(book,b);
      } while ((int)lVar4 != -1);
    }
    if (bVar3) {
      return -1;
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodev_add(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int i,j,entry;
    float *t;

    for(i=0;i<n;){
      entry = decode_packed_entry_number(book,b);
      if(entry==-1)return(-1);
      t     = book->valuelist+entry*book->dim;
      for(j=0;i<n && j<book->dim;)
        a[i++]+=t[j++];
    }
  }
  return(0);
}